

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DatatypeValidator::setTypeName(DatatypeValidator *this,XMLCh *name,XMLCh *uri)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  long lVar4;
  XMLCh *__dest;
  
  if (this->fTypeName != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
    this->fTypeName = (XMLCh *)0x0;
  }
  if (name == (XMLCh *)0x0 && uri == (XMLCh *)0x0) {
    this->fTypeLocalName = L"";
    this->fTypeUri = L"";
  }
  else {
    lVar4 = 0;
    if (name != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)name + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar1 != 0);
      lVar4 = (lVar4 >> 1) + -1;
    }
    lVar3 = 0;
    if (uri != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)uri + lVar3);
        lVar3 = lVar3 + 2;
      } while (*psVar1 != 0);
      lVar3 = (lVar3 >> 1) + -1;
    }
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,(lVar3 + lVar4) * 2 + 4);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar2);
    this->fTypeName = __dest;
    this->fTypeUri = __dest;
    this->fTypeLocalName = __dest + lVar3 + 1;
    if (uri == (XMLCh *)0x0) {
      *__dest = L'\0';
    }
    else {
      memmove(__dest,uri,(lVar3 + 1) * 2);
    }
    if (name != (XMLCh *)0x0) {
      memmove(this->fTypeName + lVar3 + 1,name,lVar4 * 2 + 2);
      return;
    }
    this->fTypeName[lVar3 + 1] = L'\0';
  }
  return;
}

Assistant:

void DatatypeValidator::setTypeName(const XMLCh* const name, const XMLCh* const uri)
{
    if (fTypeName) {

        fMemoryManager->deallocate(fTypeName);
        fTypeName = 0;
    }

    if (name || uri) {

        XMLSize_t nameLen = XMLString::stringLen(name);
        XMLSize_t uriLen = XMLString::stringLen(uri);

        fTypeName = (XMLCh*) fMemoryManager->allocate
        (
            (nameLen + uriLen + 2)*sizeof(XMLCh)
        );
        fTypeUri = fTypeName;
        fTypeLocalName = &fTypeName[uriLen+1];

        if (uri)
			XMLString::moveChars(fTypeName, uri, uriLen+1);
        else
			fTypeName[0] = chNull;

        if (name)
            XMLString::moveChars(&fTypeName[uriLen+1], name, nameLen+1);
        else
            fTypeName[uriLen+1] = chNull;
    }
    else
    {
        fTypeUri = fTypeLocalName = XMLUni::fgZeroLenString;
    }
}